

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverSearch.c
# Opt level: O0

void Msat_SolverRemoveMarked(Msat_Solver_t *p)

{
  int iVar1;
  Msat_Clause_t **ppMVar2;
  int local_2c;
  int i;
  int nClauses;
  int nLearned;
  Msat_Clause_t **pClauses;
  Msat_Clause_t **pLearned;
  Msat_Solver_t *p_local;
  
  iVar1 = Msat_ClauseVecReadSize(p->vClauses);
  ppMVar2 = Msat_ClauseVecReadArray(p->vClauses);
  for (local_2c = p->nClausesStart; local_2c < iVar1; local_2c = local_2c + 1) {
    Msat_ClauseFree(p,ppMVar2[local_2c],1);
  }
  Msat_ClauseVecShrink(p->vClauses,p->nClausesStart);
  iVar1 = Msat_ClauseVecReadSize(p->vLearned);
  ppMVar2 = Msat_ClauseVecReadArray(p->vLearned);
  for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
    Msat_ClauseFree(p,ppMVar2[local_2c],1);
  }
  Msat_ClauseVecShrink(p->vLearned,0);
  iVar1 = Msat_ClauseVecReadSize(p->vClauses);
  p->nClauses = iVar1;
  return;
}

Assistant:

void Msat_SolverRemoveMarked( Msat_Solver_t * p )
{
    Msat_Clause_t ** pLearned, ** pClauses;
    int nLearned, nClauses, i;

    // discard the learned clauses
    nClauses = Msat_ClauseVecReadSize( p->vClauses );
    pClauses = Msat_ClauseVecReadArray( p->vClauses );
    for ( i = p->nClausesStart; i < nClauses; i++ )
    {
//        assert( !Msat_ClauseIsLocked( p, pClauses[i]) );
        Msat_ClauseFree( p, pClauses[i], 1 );
    }
    Msat_ClauseVecShrink( p->vClauses, p->nClausesStart );

    // discard the learned clauses
    nLearned = Msat_ClauseVecReadSize( p->vLearned );
    pLearned = Msat_ClauseVecReadArray( p->vLearned );
    for ( i = 0; i < nLearned; i++ )
    {
//        assert( !Msat_ClauseIsLocked( p, pLearned[i]) );
        Msat_ClauseFree( p, pLearned[i], 1 );
    }
    Msat_ClauseVecShrink( p->vLearned, 0 );
    p->nClauses = Msat_ClauseVecReadSize(p->vClauses);
/*
    // undo the previous data
    for ( i = 0; i < p->nVarsAlloc; i++ )
    {
        p->pAssigns[i]   = MSAT_VAR_UNASSIGNED;
        p->pReasons[i]   = NULL;
        p->pLevel[i]     = -1;
        p->pdActivity[i] = 0.0;
    }
    Msat_OrderClean( p->pOrder, p->nVars, NULL );
    Msat_QueueClear( p->pQueue );
*/
}